

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
SimpleLogger::LoggerStream::setLogInfo
          (LoggerStream *this,int _level,SimpleLogger *_logger,char *_file,char *_func,size_t _line)

{
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  std::__cxx11::stringbuf::str((string *)&(this->super_ostream).field_0x88);
  std::__cxx11::string::~string((string *)&local_50);
  this->level = _level;
  this->logger = _logger;
  this->file = _file;
  this->func = _func;
  this->line = _line;
  return;
}

Assistant:

inline void setLogInfo(int _level,
                               SimpleLogger* _logger,
                               const char* _file,
                               const char* _func,
                               size_t _line)
        {
            sStream.str(std::string());
            level = _level;
            logger = _logger;
            file = _file;
            func = _func;
            line = _line;
        }